

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

atom * arc::make_string(atom *__return_storage_ptr__,string *x)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *x_local;
  atom *a;
  
  local_30.field_2._M_local_buf[7] = '\0';
  local_30.field_2._8_8_ = x;
  x_local = (string *)__return_storage_ptr__;
  atom::atom(__return_storage_ptr__);
  __return_storage_ptr__->type = T_STRING;
  std::make_shared<std::__cxx11::string,std::__cxx11::string_const&>(&local_30);
  std::
  variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
  ::operator=((variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
               *)&__return_storage_ptr__->val,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_30);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

atom make_string(const string& x)
	{
		atom a;
		a.type = T_STRING;
		a.val = make_shared<string>(x);
		return a;
	}